

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O2

void ncnn::transpose_pack_A_tile_quantize
               (Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk,Mat *scales)

{
  int iVar1;
  void *pvVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t *psVar10;
  long lVar11;
  long lVar12;
  float *pfVar13;
  long lVar14;
  float *pfVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  int iVar18;
  long lVar19;
  undefined1 (*pauVar20) [16];
  undefined1 (*pauVar21) [16];
  long lVar22;
  long lVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar109 [64];
  float fVar110;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [64];
  undefined1 auVar121 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar124 [64];
  undefined1 auVar126 [16];
  float fVar125;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 in_ZMM13 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar115 [32];
  
  iVar6 = cpu_support_x86_avx_vnni_int8();
  if (iVar6 == 0) {
    iVar6 = cpu_support_x86_avx_vnni();
    if (iVar6 == 0) {
      iVar6 = cpu_support_x86_avx2();
      auVar95 = _DAT_00546790;
      if (iVar6 == 0) {
        iVar6 = A->elempack;
        lVar19 = (long)iVar6;
        psVar10 = (size_t *)&A->w;
        if (A->dims == 3) {
          psVar10 = &A->cstep;
        }
        iVar1 = (int)*psVar10;
        pauVar17 = (undefined1 (*) [16])AT->data;
        iVar7 = max_kk * 4;
        lVar14 = (long)(k * iVar1);
        lVar23 = (long)i;
        iVar8 = iVar1 * 8;
        iVar9 = iVar1 * 4;
        iVar5 = iVar1 * 2;
        lVar11 = (long)max_ii;
        lVar22 = lVar14 * 4 + lVar19 * lVar23 * 4;
        auVar24._8_4_ = 0x80000000;
        auVar24._0_8_ = 0x8000000080000000;
        auVar24._12_4_ = 0x80000000;
        auVar24._16_4_ = 0x80000000;
        auVar24._20_4_ = 0x80000000;
        auVar24._24_4_ = 0x80000000;
        auVar24._28_4_ = 0x80000000;
        auVar25._8_4_ = 0x3f000000;
        auVar25._0_8_ = 0x3f0000003f000000;
        auVar25._12_4_ = 0x3f000000;
        auVar25._16_4_ = 0x3f000000;
        auVar25._20_4_ = 0x3f000000;
        auVar25._24_4_ = 0x3f000000;
        auVar25._28_4_ = 0x3f000000;
        auVar53._8_4_ = 0x7f007f;
        auVar53._0_8_ = 0x7f007f007f007f;
        auVar53._12_4_ = 0x7f007f;
        auVar87._8_4_ = 0xff81ff81;
        auVar87._0_8_ = 0xff81ff81ff81ff81;
        auVar87._12_4_ = 0xff81ff81;
        auVar85 = ZEXT1664(_DAT_00546790);
        auVar120 = ZEXT1664(_DAT_00546770);
        auVar136 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
        auVar133 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
        for (uVar16 = 0; (long)(uVar16 | 7) < lVar11; uVar16 = uVar16 + 8) {
          lVar12 = lVar23 + uVar16;
          auVar82 = *(undefined1 (*) [32])((long)scales->data + uVar16 * 4 + lVar23 * 4);
          if (iVar6 == 8) {
            pfVar15 = (float *)((long)A->data + lVar22);
            for (iVar18 = 7; iVar18 < max_kk; iVar18 = iVar18 + 8) {
              pvVar2 = scales->data;
              fVar110 = *(float *)((long)pvVar2 + lVar12 * 4);
              auVar122._0_4_ = fVar110 * *pfVar15;
              auVar122._4_4_ = fVar110 * pfVar15[1];
              auVar122._8_4_ = fVar110 * pfVar15[2];
              auVar122._12_4_ = fVar110 * pfVar15[3];
              auVar122._16_4_ = fVar110 * pfVar15[4];
              auVar122._20_4_ = fVar110 * pfVar15[5];
              auVar122._28_36_ = in_ZMM11._28_36_;
              auVar122._24_4_ = fVar110 * pfVar15[6];
              fVar110 = *(float *)((long)pvVar2 + lVar12 * 4 + 4);
              auVar134._0_4_ = fVar110 * pfVar15[8];
              auVar134._4_4_ = fVar110 * pfVar15[9];
              auVar134._8_4_ = fVar110 * pfVar15[10];
              auVar134._12_4_ = fVar110 * pfVar15[0xb];
              auVar134._16_4_ = fVar110 * pfVar15[0xc];
              auVar134._20_4_ = fVar110 * pfVar15[0xd];
              auVar134._28_36_ = auVar133._28_36_;
              auVar134._24_4_ = fVar110 * pfVar15[0xe];
              fVar110 = *(float *)((long)pvVar2 + lVar12 * 4 + 8);
              auVar120._0_4_ = fVar110 * pfVar15[0x10];
              auVar120._4_4_ = fVar110 * pfVar15[0x11];
              auVar120._8_4_ = fVar110 * pfVar15[0x12];
              auVar120._12_4_ = fVar110 * pfVar15[0x13];
              auVar120._16_4_ = fVar110 * pfVar15[0x14];
              auVar120._20_4_ = fVar110 * pfVar15[0x15];
              auVar120._28_36_ = in_ZMM7._28_36_;
              auVar120._24_4_ = fVar110 * pfVar15[0x16];
              fVar110 = *(float *)((long)pvVar2 + lVar12 * 4 + 0xc);
              auVar137._0_4_ = fVar110 * pfVar15[0x18];
              auVar137._4_4_ = fVar110 * pfVar15[0x19];
              auVar137._8_4_ = fVar110 * pfVar15[0x1a];
              auVar137._12_4_ = fVar110 * pfVar15[0x1b];
              auVar137._16_4_ = fVar110 * pfVar15[0x1c];
              auVar137._20_4_ = fVar110 * pfVar15[0x1d];
              auVar137._28_36_ = auVar136._28_36_;
              auVar137._24_4_ = fVar110 * pfVar15[0x1e];
              fVar110 = *(float *)((long)pvVar2 + lVar12 * 4 + 0x10);
              auVar124._0_4_ = fVar110 * pfVar15[0x20];
              auVar124._4_4_ = fVar110 * pfVar15[0x21];
              auVar124._8_4_ = fVar110 * pfVar15[0x22];
              auVar124._12_4_ = fVar110 * pfVar15[0x23];
              auVar124._16_4_ = fVar110 * pfVar15[0x24];
              auVar124._20_4_ = fVar110 * pfVar15[0x25];
              auVar124._28_36_ = in_ZMM12._28_36_;
              auVar124._24_4_ = fVar110 * pfVar15[0x26];
              fVar110 = *(float *)((long)pvVar2 + lVar12 * 4 + 0x14);
              auVar3._4_4_ = fVar110 * pfVar15[0x29];
              auVar3._0_4_ = fVar110 * pfVar15[0x28];
              auVar3._8_4_ = fVar110 * pfVar15[0x2a];
              auVar3._12_4_ = fVar110 * pfVar15[0x2b];
              auVar3._16_4_ = fVar110 * pfVar15[0x2c];
              auVar3._20_4_ = fVar110 * pfVar15[0x2d];
              auVar3._24_4_ = fVar110 * pfVar15[0x2e];
              auVar3._28_4_ = fVar110;
              fVar116 = *(float *)((long)pvVar2 + lVar12 * 4 + 0x18);
              auVar127._0_4_ = fVar116 * pfVar15[0x30];
              auVar127._4_4_ = fVar116 * pfVar15[0x31];
              auVar127._8_4_ = fVar116 * pfVar15[0x32];
              auVar127._12_4_ = fVar116 * pfVar15[0x33];
              auVar127._16_4_ = fVar116 * pfVar15[0x34];
              auVar127._20_4_ = fVar116 * pfVar15[0x35];
              auVar127._28_36_ = in_ZMM13._28_36_;
              auVar127._24_4_ = fVar116 * pfVar15[0x36];
              fVar116 = *(float *)((long)pvVar2 + lVar12 * 4 + 0x1c);
              auVar4._4_4_ = fVar116 * pfVar15[0x39];
              auVar4._0_4_ = fVar116 * pfVar15[0x38];
              auVar4._8_4_ = fVar116 * pfVar15[0x3a];
              auVar4._12_4_ = fVar116 * pfVar15[0x3b];
              auVar4._16_4_ = fVar116 * pfVar15[0x3c];
              auVar4._20_4_ = fVar116 * pfVar15[0x3d];
              auVar4._24_4_ = fVar116 * pfVar15[0x3e];
              auVar4._28_4_ = fVar116;
              auVar54 = vandps_avx(auVar122._0_32_,auVar24);
              auVar59 = vandps_avx(auVar120._0_32_,auVar24);
              auVar54 = vorps_avx(auVar54,auVar25);
              auVar59 = vorps_avx(auVar59,auVar25);
              auVar88._0_4_ = (int)(auVar122._0_4_ + auVar54._0_4_);
              auVar88._4_4_ = (int)(auVar122._4_4_ + auVar54._4_4_);
              auVar88._8_4_ = (int)(auVar122._8_4_ + auVar54._8_4_);
              auVar88._12_4_ = (int)(auVar122._12_4_ + auVar54._12_4_);
              auVar96._16_4_ = (int)(auVar122._16_4_ + auVar54._16_4_);
              auVar96._0_16_ = auVar88;
              auVar96._20_4_ = (int)(auVar122._20_4_ + auVar54._20_4_);
              auVar96._24_4_ = (int)(auVar122._24_4_ + auVar54._24_4_);
              auVar96._28_4_ = (int)(in_ZMM11._28_4_ + auVar54._28_4_);
              auVar47._0_4_ = (int)(auVar120._0_4_ + auVar59._0_4_);
              auVar47._4_4_ = (int)(auVar120._4_4_ + auVar59._4_4_);
              auVar47._8_4_ = (int)(auVar120._8_4_ + auVar59._8_4_);
              auVar47._12_4_ = (int)(auVar120._12_4_ + auVar59._12_4_);
              auVar54._16_4_ = (int)(auVar120._16_4_ + auVar59._16_4_);
              auVar54._0_16_ = auVar47;
              auVar54._20_4_ = (int)(auVar120._20_4_ + auVar59._20_4_);
              auVar54._24_4_ = (int)(auVar120._24_4_ + auVar59._24_4_);
              auVar54._28_4_ = (int)(in_ZMM7._28_4_ + auVar59._28_4_);
              auVar88 = vpackssdw_avx(auVar88,auVar96._16_16_);
              auVar47 = vpackssdw_avx(auVar47,auVar54._16_16_);
              auVar88 = vpminsw_avx(auVar88,auVar53);
              auVar47 = vpminsw_avx(auVar47,auVar53);
              auVar88 = vpmaxsw_avx(auVar88,auVar87);
              auVar47 = vpmaxsw_avx(auVar47,auVar87);
              auVar88 = vpacksswb_avx(auVar88,auVar47);
              in_ZMM11 = ZEXT1664(auVar88);
              auVar54 = vandps_avx(auVar134._0_32_,auVar24);
              auVar59 = vandps_avx(auVar137._0_32_,auVar24);
              auVar54 = vorps_avx(auVar54,auVar25);
              auVar59 = vorps_avx(auVar59,auVar25);
              auVar26._0_4_ = (int)(auVar134._0_4_ + auVar54._0_4_);
              auVar26._4_4_ = (int)(auVar134._4_4_ + auVar54._4_4_);
              auVar26._8_4_ = (int)(auVar134._8_4_ + auVar54._8_4_);
              auVar26._12_4_ = (int)(auVar134._12_4_ + auVar54._12_4_);
              auVar55._16_4_ = (int)(auVar134._16_4_ + auVar54._16_4_);
              auVar55._0_16_ = auVar26;
              auVar55._20_4_ = (int)(auVar134._20_4_ + auVar54._20_4_);
              auVar55._24_4_ = (int)(auVar134._24_4_ + auVar54._24_4_);
              auVar55._28_4_ = (int)(auVar133._28_4_ + auVar54._28_4_);
              auVar89._0_4_ = (int)(auVar137._0_4_ + auVar59._0_4_);
              auVar89._4_4_ = (int)(auVar137._4_4_ + auVar59._4_4_);
              auVar89._8_4_ = (int)(auVar137._8_4_ + auVar59._8_4_);
              auVar89._12_4_ = (int)(auVar137._12_4_ + auVar59._12_4_);
              auVar97._16_4_ = (int)(auVar137._16_4_ + auVar59._16_4_);
              auVar97._0_16_ = auVar89;
              auVar97._20_4_ = (int)(auVar137._20_4_ + auVar59._20_4_);
              auVar97._24_4_ = (int)(auVar137._24_4_ + auVar59._24_4_);
              auVar97._28_4_ = (int)(auVar136._28_4_ + auVar59._28_4_);
              auVar47 = vpackssdw_avx(auVar26,auVar55._16_16_);
              auVar26 = vpackssdw_avx(auVar89,auVar97._16_16_);
              auVar47 = vpminsw_avx(auVar47,auVar53);
              auVar26 = vpminsw_avx(auVar26,auVar53);
              auVar47 = vpmaxsw_avx(auVar47,auVar87);
              auVar26 = vpmaxsw_avx(auVar26,auVar87);
              auVar47 = vpacksswb_avx(auVar47,auVar26);
              auVar133 = ZEXT1664(auVar47);
              auVar54 = vandps_avx(auVar124._0_32_,auVar24);
              auVar59 = vandps_avx(auVar127._0_32_,auVar24);
              auVar54 = vorps_avx(auVar54,auVar25);
              auVar59 = vorps_avx(auVar59,auVar25);
              auVar27._0_4_ = (int)(auVar124._0_4_ + auVar54._0_4_);
              auVar27._4_4_ = (int)(auVar124._4_4_ + auVar54._4_4_);
              auVar27._8_4_ = (int)(auVar124._8_4_ + auVar54._8_4_);
              auVar27._12_4_ = (int)(auVar124._12_4_ + auVar54._12_4_);
              auVar56._16_4_ = (int)(auVar124._16_4_ + auVar54._16_4_);
              auVar56._0_16_ = auVar27;
              auVar56._20_4_ = (int)(auVar124._20_4_ + auVar54._20_4_);
              auVar56._24_4_ = (int)(auVar124._24_4_ + auVar54._24_4_);
              auVar56._28_4_ = (int)(in_ZMM12._28_4_ + auVar54._28_4_);
              auVar90._0_4_ = (int)(auVar127._0_4_ + auVar59._0_4_);
              auVar90._4_4_ = (int)(auVar127._4_4_ + auVar59._4_4_);
              auVar90._8_4_ = (int)(auVar127._8_4_ + auVar59._8_4_);
              auVar90._12_4_ = (int)(auVar127._12_4_ + auVar59._12_4_);
              auVar98._16_4_ = (int)(auVar127._16_4_ + auVar59._16_4_);
              auVar98._0_16_ = auVar90;
              auVar98._20_4_ = (int)(auVar127._20_4_ + auVar59._20_4_);
              auVar98._24_4_ = (int)(auVar127._24_4_ + auVar59._24_4_);
              auVar98._28_4_ = (int)(in_ZMM13._28_4_ + auVar59._28_4_);
              in_ZMM12 = ZEXT1664(auVar98._16_16_);
              auVar26 = vpackssdw_avx(auVar27,auVar56._16_16_);
              auVar27 = vpackssdw_avx(auVar90,auVar98._16_16_);
              auVar26 = vpminsw_avx(auVar26,auVar53);
              auVar27 = vpminsw_avx(auVar27,auVar53);
              auVar26 = vpmaxsw_avx(auVar26,auVar87);
              auVar27 = vpmaxsw_avx(auVar27,auVar87);
              auVar26 = vpacksswb_avx(auVar26,auVar27);
              auVar54 = vandps_avx(auVar3,auVar24);
              auVar59 = vandps_avx(auVar4,auVar24);
              auVar54 = vorps_avx(auVar54,auVar25);
              auVar59 = vorps_avx(auVar59,auVar25);
              auVar91._0_4_ = (int)(fVar110 * pfVar15[0x28] + auVar54._0_4_);
              auVar91._4_4_ = (int)(fVar110 * pfVar15[0x29] + auVar54._4_4_);
              auVar91._8_4_ = (int)(fVar110 * pfVar15[0x2a] + auVar54._8_4_);
              auVar91._12_4_ = (int)(fVar110 * pfVar15[0x2b] + auVar54._12_4_);
              auVar99._16_4_ = (int)(fVar110 * pfVar15[0x2c] + auVar54._16_4_);
              auVar99._0_16_ = auVar91;
              auVar99._20_4_ = (int)(fVar110 * pfVar15[0x2d] + auVar54._20_4_);
              auVar99._24_4_ = (int)(fVar110 * pfVar15[0x2e] + auVar54._24_4_);
              auVar99._28_4_ = (int)(fVar110 + auVar54._28_4_);
              auVar104._0_4_ = (int)(fVar116 * pfVar15[0x38] + auVar59._0_4_);
              auVar104._4_4_ = (int)(fVar116 * pfVar15[0x39] + auVar59._4_4_);
              auVar104._8_4_ = (int)(fVar116 * pfVar15[0x3a] + auVar59._8_4_);
              auVar104._12_4_ = (int)(fVar116 * pfVar15[0x3b] + auVar59._12_4_);
              auVar107._16_4_ = (int)(fVar116 * pfVar15[0x3c] + auVar59._16_4_);
              auVar107._0_16_ = auVar104;
              auVar107._20_4_ = (int)(fVar116 * pfVar15[0x3d] + auVar59._20_4_);
              auVar107._24_4_ = (int)(fVar116 * pfVar15[0x3e] + auVar59._24_4_);
              auVar107._28_4_ = (int)(fVar116 + auVar59._28_4_);
              auVar27 = vpackssdw_avx(auVar91,auVar99._16_16_);
              auVar89 = vpackssdw_avx(auVar104,auVar107._16_16_);
              auVar27 = vpminsw_avx(auVar27,auVar53);
              auVar89 = vpminsw_avx(auVar89,auVar53);
              auVar27 = vpmaxsw_avx(auVar27,auVar87);
              auVar89 = vpmaxsw_avx(auVar89,auVar87);
              auVar27 = vpacksswb_avx(auVar27,auVar89);
              auVar89 = vpunpcklwd_avx(auVar88,auVar47);
              auVar88 = vpunpckhwd_avx(auVar88,auVar47);
              auVar90 = vpunpcklwd_avx(auVar26,auVar27);
              auVar47 = vpunpckhwd_avx(auVar26,auVar27);
              auVar26 = vpunpckldq_avx(auVar89,auVar88);
              in_ZMM6 = ZEXT1664(auVar26);
              auVar88 = vpunpckhdq_avx(auVar89,auVar88);
              in_ZMM7 = ZEXT1664(auVar88);
              auVar27 = vpunpckldq_avx(auVar90,auVar47);
              auVar47 = vpunpckhdq_avx(auVar90,auVar47);
              in_ZMM2 = ZEXT1664(auVar47);
              *pauVar17 = auVar26;
              pauVar17[1] = auVar88;
              *(undefined1 (*) [16])(*pauVar17 + iVar7) = auVar27;
              *(undefined1 (*) [16])(pauVar17[1] + iVar7) = auVar47;
              pauVar17 = pauVar17 + 2;
              pfVar15 = pfVar15 + iVar8;
              in_ZMM13 = ZEXT3264(auVar127._0_32_);
              auVar136 = ZEXT3264(auVar137._0_32_);
            }
            auVar136 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
            auVar133 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
            auVar120 = ZEXT1664(_DAT_00546770);
          }
          else {
            pfVar15 = (float *)((long)A->data + lVar12 * lVar19 * 4 + lVar14 * 4);
          }
          pauVar20 = (undefined1 (*) [16])(*pauVar17 + iVar7);
          if (iVar6 == 4) {
            auVar54 = vshufps_avx(auVar82,auVar82,0);
            in_ZMM2 = ZEXT3264(auVar54);
            auVar59 = vshufps_avx(auVar82,auVar82,0x55);
            in_ZMM6 = ZEXT3264(auVar59);
            auVar3 = vshufps_avx(auVar82,auVar82,0xaa);
            in_ZMM7 = ZEXT3264(auVar3);
            auVar4 = vshufps_avx(auVar82,auVar82,0xff);
            auVar55 = vperm2f128_avx(auVar54,auVar59,0x31);
            in_ZMM11 = ZEXT3264(auVar55);
            auVar56 = vperm2f128_avx(auVar3,auVar4,0x31);
            in_ZMM12 = ZEXT3264(auVar56);
            for (iVar18 = 3; iVar18 < max_kk; iVar18 = iVar18 + 4) {
              auVar136._0_4_ = auVar54._0_4_ * *pfVar15;
              auVar136._4_4_ = auVar54._4_4_ * pfVar15[1];
              auVar136._8_4_ = auVar54._8_4_ * pfVar15[2];
              auVar136._12_4_ = auVar54._12_4_ * pfVar15[3];
              auVar136._16_4_ = auVar59._0_4_ * pfVar15[4];
              auVar136._20_4_ = auVar59._4_4_ * pfVar15[5];
              auVar136._28_36_ = in_ZMM2._28_36_;
              auVar136._24_4_ = auVar59._8_4_ * pfVar15[6];
              auVar133._0_4_ = auVar3._0_4_ * pfVar15[8];
              auVar133._4_4_ = auVar3._4_4_ * pfVar15[9];
              auVar133._8_4_ = auVar3._8_4_ * pfVar15[10];
              auVar133._12_4_ = auVar3._12_4_ * pfVar15[0xb];
              auVar133._16_4_ = auVar4._0_4_ * pfVar15[0xc];
              auVar133._20_4_ = auVar4._4_4_ * pfVar15[0xd];
              auVar133._28_36_ = in_ZMM6._28_36_;
              auVar133._24_4_ = auVar4._8_4_ * pfVar15[0xe];
              auVar109._0_4_ = auVar55._0_4_ * pfVar15[0x10];
              auVar109._4_4_ = auVar55._4_4_ * pfVar15[0x11];
              auVar109._8_4_ = auVar55._8_4_ * pfVar15[0x12];
              auVar109._12_4_ = auVar55._12_4_ * pfVar15[0x13];
              auVar109._16_4_ = auVar55._16_4_ * pfVar15[0x14];
              auVar109._20_4_ = auVar55._20_4_ * pfVar15[0x15];
              auVar109._28_36_ = in_ZMM7._28_36_;
              auVar109._24_4_ = auVar55._24_4_ * pfVar15[0x16];
              auVar128._0_4_ = auVar56._0_4_ * pfVar15[0x18];
              auVar128._4_4_ = auVar56._4_4_ * pfVar15[0x19];
              auVar128._8_4_ = auVar56._8_4_ * pfVar15[0x1a];
              auVar128._12_4_ = auVar56._12_4_ * pfVar15[0x1b];
              auVar128._16_4_ = auVar56._16_4_ * pfVar15[0x1c];
              auVar128._20_4_ = auVar56._20_4_ * pfVar15[0x1d];
              auVar128._28_36_ = in_ZMM13._28_36_;
              auVar128._24_4_ = auVar56._24_4_ * pfVar15[0x1e];
              auVar96 = vandps_avx(auVar136._0_32_,auVar24);
              auVar97 = vandps_avx(auVar133._0_32_,auVar24);
              auVar96 = vorps_avx(auVar96,auVar25);
              auVar97 = vorps_avx(auVar97,auVar25);
              auVar28._0_4_ = (int)(auVar96._0_4_ + auVar136._0_4_);
              auVar28._4_4_ = (int)(auVar96._4_4_ + auVar136._4_4_);
              auVar28._8_4_ = (int)(auVar96._8_4_ + auVar136._8_4_);
              auVar28._12_4_ = (int)(auVar96._12_4_ + auVar136._12_4_);
              auVar57._16_4_ = (int)(auVar96._16_4_ + auVar136._16_4_);
              auVar57._0_16_ = auVar28;
              auVar57._20_4_ = (int)(auVar96._20_4_ + auVar136._20_4_);
              auVar57._24_4_ = (int)(auVar96._24_4_ + auVar136._24_4_);
              auVar57._28_4_ = (int)(auVar96._28_4_ + in_ZMM2._28_4_);
              auVar92._0_4_ = (int)(auVar97._0_4_ + auVar133._0_4_);
              auVar92._4_4_ = (int)(auVar97._4_4_ + auVar133._4_4_);
              auVar92._8_4_ = (int)(auVar97._8_4_ + auVar133._8_4_);
              auVar92._12_4_ = (int)(auVar97._12_4_ + auVar133._12_4_);
              auVar100._16_4_ = (int)(auVar97._16_4_ + auVar133._16_4_);
              auVar100._0_16_ = auVar92;
              auVar100._20_4_ = (int)(auVar97._20_4_ + auVar133._20_4_);
              auVar100._24_4_ = (int)(auVar97._24_4_ + auVar133._24_4_);
              auVar100._28_4_ = (int)(auVar97._28_4_ + in_ZMM6._28_4_);
              auVar88 = vpackssdw_avx(auVar28,auVar57._16_16_);
              auVar47 = vpackssdw_avx(auVar92,auVar100._16_16_);
              auVar136 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
              auVar88 = vpminsw_avx(auVar88,auVar53);
              auVar47 = vpminsw_avx(auVar47,auVar53);
              auVar88 = vpmaxsw_avx(auVar88,auVar87);
              auVar47 = vpmaxsw_avx(auVar47,auVar87);
              auVar88 = vpacksswb_avx(auVar88,auVar47);
              auVar96 = vandps_avx(auVar109._0_32_,auVar24);
              auVar97 = vandps_avx(auVar128._0_32_,auVar24);
              auVar96 = vorps_avx(auVar96,auVar25);
              auVar97 = vorps_avx(auVar97,auVar25);
              auVar93._0_4_ = (int)(auVar109._0_4_ + auVar96._0_4_);
              auVar93._4_4_ = (int)(auVar109._4_4_ + auVar96._4_4_);
              auVar93._8_4_ = (int)(auVar109._8_4_ + auVar96._8_4_);
              auVar93._12_4_ = (int)(auVar109._12_4_ + auVar96._12_4_);
              auVar101._16_4_ = (int)(auVar109._16_4_ + auVar96._16_4_);
              auVar101._0_16_ = auVar93;
              auVar101._20_4_ = (int)(auVar109._20_4_ + auVar96._20_4_);
              auVar101._24_4_ = (int)(auVar109._24_4_ + auVar96._24_4_);
              auVar101._28_4_ = (int)(in_ZMM7._28_4_ + auVar96._28_4_);
              auVar105._0_4_ = (int)(auVar128._0_4_ + auVar97._0_4_);
              auVar105._4_4_ = (int)(auVar128._4_4_ + auVar97._4_4_);
              auVar105._8_4_ = (int)(auVar128._8_4_ + auVar97._8_4_);
              auVar105._12_4_ = (int)(auVar128._12_4_ + auVar97._12_4_);
              auVar108._16_4_ = (int)(auVar128._16_4_ + auVar97._16_4_);
              auVar108._0_16_ = auVar105;
              auVar108._20_4_ = (int)(auVar128._20_4_ + auVar97._20_4_);
              auVar108._24_4_ = (int)(auVar128._24_4_ + auVar97._24_4_);
              auVar108._28_4_ = (int)(in_ZMM13._28_4_ + auVar97._28_4_);
              in_ZMM13 = ZEXT1664(auVar101._16_16_);
              auVar47 = vpackssdw_avx(auVar93,auVar101._16_16_);
              auVar26 = vpackssdw_avx(auVar105,auVar108._16_16_);
              auVar133 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
              auVar47 = vpminsw_avx(auVar47,auVar53);
              auVar26 = vpminsw_avx(auVar26,auVar53);
              auVar47 = vpmaxsw_avx(auVar47,auVar87);
              auVar26 = vpmaxsw_avx(auVar26,auVar87);
              in_ZMM7 = ZEXT1664(auVar26);
              auVar47 = vpacksswb_avx(auVar47,auVar26);
              auVar88 = vpshufb_avx(auVar88,auVar95);
              in_ZMM2 = ZEXT1664(auVar88);
              auVar47 = vpshufb_avx(auVar47,auVar95);
              in_ZMM6 = ZEXT1664(auVar47);
              *pauVar17 = auVar88;
              *pauVar20 = auVar47;
              pauVar17 = pauVar17 + 1;
              pauVar20 = pauVar20 + 1;
              pfVar15 = pfVar15 + iVar9;
            }
            auVar120 = ZEXT1664(_DAT_00546770);
          }
          if (iVar6 == 1) {
            lVar12 = 0;
            iVar18 = 0;
            pauVar21 = pauVar17;
            while( true ) {
              fVar110 = auVar82._0_4_;
              fVar116 = auVar82._4_4_;
              fVar117 = auVar82._8_4_;
              fVar118 = auVar82._12_4_;
              fVar125 = auVar82._16_4_;
              fVar130 = auVar82._20_4_;
              fVar131 = auVar82._24_4_;
              if (max_kk <= iVar18 + 1) break;
              auVar63._0_4_ = fVar110 * *pfVar15;
              auVar63._4_4_ = fVar116 * pfVar15[1];
              auVar63._8_4_ = fVar117 * pfVar15[2];
              auVar63._12_4_ = fVar118 * pfVar15[3];
              auVar63._16_4_ = fVar125 * pfVar15[4];
              auVar63._20_4_ = fVar130 * pfVar15[5];
              auVar63._28_36_ = in_ZMM2._28_36_;
              auVar63._24_4_ = fVar131 * pfVar15[6];
              pfVar13 = pfVar15 + iVar1;
              auVar103._0_4_ = fVar110 * *pfVar13;
              auVar103._4_4_ = fVar116 * pfVar13[1];
              auVar103._8_4_ = fVar117 * pfVar13[2];
              auVar103._12_4_ = fVar118 * pfVar13[3];
              auVar103._16_4_ = fVar125 * pfVar13[4];
              auVar103._20_4_ = fVar130 * pfVar13[5];
              auVar103._28_36_ = in_ZMM6._28_36_;
              auVar103._24_4_ = fVar131 * pfVar13[6];
              auVar54 = vandps_avx(auVar63._0_32_,auVar24);
              auVar59 = vandps_avx(auVar103._0_32_,auVar24);
              auVar54 = vorps_avx(auVar54,auVar25);
              auVar59 = vorps_avx(auVar59,auVar25);
              auVar29._0_4_ = (int)(auVar63._0_4_ + auVar54._0_4_);
              auVar29._4_4_ = (int)(auVar63._4_4_ + auVar54._4_4_);
              auVar29._8_4_ = (int)(auVar63._8_4_ + auVar54._8_4_);
              auVar29._12_4_ = (int)(auVar63._12_4_ + auVar54._12_4_);
              auVar58._16_4_ = (int)(auVar63._16_4_ + auVar54._16_4_);
              auVar58._0_16_ = auVar29;
              auVar58._20_4_ = (int)(auVar63._20_4_ + auVar54._20_4_);
              auVar58._24_4_ = (int)(auVar63._24_4_ + auVar54._24_4_);
              auVar58._28_4_ = (int)(in_ZMM2._28_4_ + auVar54._28_4_);
              auVar94._0_4_ = (int)(auVar59._0_4_ + auVar103._0_4_);
              auVar94._4_4_ = (int)(auVar59._4_4_ + auVar103._4_4_);
              auVar94._8_4_ = (int)(auVar59._8_4_ + auVar103._8_4_);
              auVar94._12_4_ = (int)(auVar59._12_4_ + auVar103._12_4_);
              auVar102._16_4_ = (int)(auVar59._16_4_ + auVar103._16_4_);
              auVar102._0_16_ = auVar94;
              auVar102._20_4_ = (int)(auVar59._20_4_ + auVar103._20_4_);
              auVar102._24_4_ = (int)(auVar59._24_4_ + auVar103._24_4_);
              auVar102._28_4_ = (int)(auVar59._28_4_ + in_ZMM6._28_4_);
              in_ZMM7 = ZEXT1664(auVar58._16_16_);
              auVar88 = vpackssdw_avx(auVar29,auVar58._16_16_);
              auVar47 = vpackssdw_avx(auVar94,auVar102._16_16_);
              auVar88 = vpminsw_avx(auVar88,auVar53);
              auVar47 = vpminsw_avx(auVar47,auVar53);
              auVar88 = vpmaxsw_avx(auVar88,auVar87);
              auVar47 = vpmaxsw_avx(auVar47,auVar87);
              in_ZMM6 = ZEXT1664(auVar47);
              auVar88 = vpacksswb_avx(auVar88,auVar47);
              auVar88 = vpshufb_avx(auVar88,auVar120._0_16_);
              *(long *)*pauVar21 = auVar88._0_8_;
              auVar88 = vpshufd_avx(auVar88,0x4e);
              in_ZMM2 = ZEXT1664(auVar88);
              *(long *)*pauVar20 = auVar88._0_8_;
              pauVar21 = (undefined1 (*) [16])(*pauVar21 + 8);
              pauVar20 = (undefined1 (*) [16])(*pauVar20 + 8);
              iVar18 = iVar18 + 2;
              pfVar15 = pfVar15 + iVar5;
              lVar12 = lVar12 + 2;
            }
            for (; (int)lVar12 < max_kk; lVar12 = lVar12 + 1) {
              auVar64._0_4_ = fVar110 * *pfVar15;
              auVar64._4_4_ = fVar116 * pfVar15[1];
              auVar64._8_4_ = fVar117 * pfVar15[2];
              auVar64._12_4_ = fVar118 * pfVar15[3];
              auVar64._16_4_ = fVar125 * pfVar15[4];
              auVar64._20_4_ = fVar130 * pfVar15[5];
              auVar64._28_36_ = in_ZMM2._28_36_;
              auVar64._24_4_ = fVar131 * pfVar15[6];
              auVar82 = vandps_avx(auVar64._0_32_,auVar24);
              auVar82 = vorps_avx(auVar82,auVar25);
              auVar30._0_4_ = (int)(auVar64._0_4_ + auVar82._0_4_);
              auVar30._4_4_ = (int)(auVar64._4_4_ + auVar82._4_4_);
              auVar30._8_4_ = (int)(auVar64._8_4_ + auVar82._8_4_);
              auVar30._12_4_ = (int)(auVar64._12_4_ + auVar82._12_4_);
              auVar59._16_4_ = (int)(auVar64._16_4_ + auVar82._16_4_);
              auVar59._0_16_ = auVar30;
              auVar59._20_4_ = (int)(auVar64._20_4_ + auVar82._20_4_);
              auVar59._24_4_ = (int)(auVar64._24_4_ + auVar82._24_4_);
              auVar59._28_4_ = (int)(in_ZMM2._28_4_ + auVar82._28_4_);
              in_ZMM6 = ZEXT1664(auVar59._16_16_);
              auVar88 = vpackssdw_avx(auVar30,auVar59._16_16_);
              auVar88 = vpminsw_avx(auVar136._0_16_,auVar88);
              auVar88 = vpmaxsw_avx(auVar133._0_16_,auVar88);
              auVar88 = vpacksswb_avx(auVar88,auVar88);
              in_ZMM2 = ZEXT1664(auVar88);
              *(int *)(*pauVar17 + lVar12 * 4) = auVar88._0_4_;
              *(int *)*pauVar20 = auVar88._4_4_;
              pauVar20 = (undefined1 (*) [16])(*pauVar20 + 4);
              pfVar15 = pfVar15 + iVar1;
            }
          }
          pauVar17 = pauVar20;
          lVar22 = lVar22 + lVar19 * 0x20;
        }
        auVar95._8_4_ = 0x80000000;
        auVar95._0_8_ = 0x8000000080000000;
        auVar95._12_4_ = 0x80000000;
        auVar106._8_4_ = 0x3f000000;
        auVar106._0_8_ = 0x3f0000003f000000;
        auVar106._12_4_ = 0x3f000000;
        for (; auVar88 = _DAT_0053bef0, (long)(uVar16 | 3) < lVar11; uVar16 = uVar16 + 4) {
          lVar12 = lVar23 + uVar16;
          if (iVar6 == 8) {
            pvVar2 = scales->data;
            fVar110 = *(float *)((long)pvVar2 + lVar12 * 4);
            fVar116 = *(float *)((long)pvVar2 + lVar12 * 4 + 4);
            fVar117 = *(float *)((long)pvVar2 + lVar12 * 4 + 8);
            fVar118 = *(float *)((long)pvVar2 + lVar12 * 4 + 0xc);
            pfVar15 = (float *)((long)A->data + lVar22);
            for (iVar7 = 7; iVar7 < max_kk; iVar7 = iVar7 + 8) {
              auVar85._0_4_ = fVar110 * *pfVar15;
              auVar85._4_4_ = fVar110 * pfVar15[1];
              auVar85._8_4_ = fVar110 * pfVar15[2];
              auVar85._12_4_ = fVar110 * pfVar15[3];
              auVar85._16_4_ = fVar110 * pfVar15[4];
              auVar85._20_4_ = fVar110 * pfVar15[5];
              auVar85._28_36_ = in_ZMM2._28_36_;
              auVar85._24_4_ = fVar110 * pfVar15[6];
              auVar129._0_4_ = fVar116 * pfVar15[8];
              auVar129._4_4_ = fVar116 * pfVar15[9];
              auVar129._8_4_ = fVar116 * pfVar15[10];
              auVar129._12_4_ = fVar116 * pfVar15[0xb];
              auVar129._16_4_ = fVar116 * pfVar15[0xc];
              auVar129._20_4_ = fVar116 * pfVar15[0xd];
              auVar129._28_36_ = in_ZMM13._28_36_;
              auVar129._24_4_ = fVar116 * pfVar15[0xe];
              auVar135._0_4_ = fVar117 * pfVar15[0x10];
              auVar135._4_4_ = fVar117 * pfVar15[0x11];
              auVar135._8_4_ = fVar117 * pfVar15[0x12];
              auVar135._12_4_ = fVar117 * pfVar15[0x13];
              auVar135._16_4_ = fVar117 * pfVar15[0x14];
              auVar135._20_4_ = fVar117 * pfVar15[0x15];
              auVar135._28_36_ = auVar133._28_36_;
              auVar135._24_4_ = fVar117 * pfVar15[0x16];
              auVar138._0_4_ = fVar118 * pfVar15[0x18];
              auVar138._4_4_ = fVar118 * pfVar15[0x19];
              auVar138._8_4_ = fVar118 * pfVar15[0x1a];
              auVar138._12_4_ = fVar118 * pfVar15[0x1b];
              auVar138._16_4_ = fVar118 * pfVar15[0x1c];
              auVar138._20_4_ = fVar118 * pfVar15[0x1d];
              auVar138._28_36_ = auVar136._28_36_;
              auVar138._24_4_ = fVar118 * pfVar15[0x1e];
              auVar82 = vandps_avx(auVar85._0_32_,auVar24);
              auVar54 = vandps_avx(auVar135._0_32_,auVar24);
              auVar82 = vorps_avx(auVar82,auVar25);
              auVar54 = vorps_avx(auVar54,auVar25);
              auVar31._0_4_ = (int)(auVar82._0_4_ + auVar85._0_4_);
              auVar31._4_4_ = (int)(auVar82._4_4_ + auVar85._4_4_);
              auVar31._8_4_ = (int)(auVar82._8_4_ + auVar85._8_4_);
              auVar31._12_4_ = (int)(auVar82._12_4_ + auVar85._12_4_);
              auVar60._16_4_ = (int)(auVar82._16_4_ + auVar85._16_4_);
              auVar60._0_16_ = auVar31;
              auVar60._20_4_ = (int)(auVar82._20_4_ + auVar85._20_4_);
              auVar60._24_4_ = (int)(auVar82._24_4_ + auVar85._24_4_);
              auVar60._28_4_ = (int)(auVar82._28_4_ + in_ZMM2._28_4_);
              auVar67._0_4_ = (int)(auVar135._0_4_ + auVar54._0_4_);
              auVar67._4_4_ = (int)(auVar135._4_4_ + auVar54._4_4_);
              auVar67._8_4_ = (int)(auVar135._8_4_ + auVar54._8_4_);
              auVar67._12_4_ = (int)(auVar135._12_4_ + auVar54._12_4_);
              auVar82._16_4_ = (int)(auVar135._16_4_ + auVar54._16_4_);
              auVar82._0_16_ = auVar67;
              auVar82._20_4_ = (int)(auVar135._20_4_ + auVar54._20_4_);
              auVar82._24_4_ = (int)(auVar135._24_4_ + auVar54._24_4_);
              auVar82._28_4_ = (int)(auVar133._28_4_ + auVar54._28_4_);
              auVar88 = vpackssdw_avx(auVar31,auVar60._16_16_);
              auVar47 = vpackssdw_avx(auVar67,auVar82._16_16_);
              auVar88 = vpminsw_avx(auVar88,auVar53);
              auVar47 = vpminsw_avx(auVar47,auVar53);
              auVar88 = vpmaxsw_avx(auVar88,auVar87);
              auVar47 = vpmaxsw_avx(auVar47,auVar87);
              auVar88 = vpacksswb_avx(auVar88,auVar47);
              auVar82 = vandps_avx(auVar129._0_32_,auVar24);
              auVar54 = vandps_avx(auVar138._0_32_,auVar24);
              auVar82 = vorps_avx(auVar82,auVar25);
              auVar54 = vorps_avx(auVar54,auVar25);
              fVar125 = auVar136._28_4_;
              auVar136 = ZEXT1664(CONCAT412(0x7f007f,CONCAT48(0x7f007f,0x7f007f007f007f)));
              auVar68._0_4_ = (int)(auVar129._0_4_ + auVar82._0_4_);
              auVar68._4_4_ = (int)(auVar129._4_4_ + auVar82._4_4_);
              auVar68._8_4_ = (int)(auVar129._8_4_ + auVar82._8_4_);
              auVar68._12_4_ = (int)(auVar129._12_4_ + auVar82._12_4_);
              auVar83._16_4_ = (int)(auVar129._16_4_ + auVar82._16_4_);
              auVar83._0_16_ = auVar68;
              auVar83._20_4_ = (int)(auVar129._20_4_ + auVar82._20_4_);
              auVar83._24_4_ = (int)(auVar129._24_4_ + auVar82._24_4_);
              auVar83._28_4_ = (int)(in_ZMM13._28_4_ + auVar82._28_4_);
              auVar111._0_4_ = (int)(auVar138._0_4_ + auVar54._0_4_);
              auVar111._4_4_ = (int)(auVar138._4_4_ + auVar54._4_4_);
              auVar111._8_4_ = (int)(auVar138._8_4_ + auVar54._8_4_);
              auVar111._12_4_ = (int)(auVar138._12_4_ + auVar54._12_4_);
              auVar115._16_4_ = (int)(auVar138._16_4_ + auVar54._16_4_);
              auVar115._0_16_ = auVar111;
              auVar115._20_4_ = (int)(auVar138._20_4_ + auVar54._20_4_);
              auVar115._24_4_ = (int)(auVar138._24_4_ + auVar54._24_4_);
              auVar115._28_4_ = (int)(fVar125 + auVar54._28_4_);
              in_ZMM13 = ZEXT1664(auVar83._16_16_);
              auVar47 = vpackssdw_avx(auVar68,auVar83._16_16_);
              auVar26 = vpackssdw_avx(auVar111,auVar115._16_16_);
              auVar133 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
              auVar47 = vpminsw_avx(auVar47,auVar53);
              auVar26 = vpminsw_avx(auVar26,auVar53);
              auVar47 = vpmaxsw_avx(auVar47,auVar87);
              auVar26 = vpmaxsw_avx(auVar26,auVar87);
              auVar47 = vpacksswb_avx(auVar47,auVar26);
              auVar26 = vpunpcklwd_avx(auVar88,auVar47);
              auVar88 = vpunpckhwd_avx(auVar88,auVar47);
              auVar47 = vpunpckldq_avx(auVar26,auVar88);
              auVar85 = ZEXT1664(auVar47);
              auVar88 = vpunpckhdq_avx(auVar26,auVar88);
              in_ZMM2 = ZEXT1664(auVar88);
              *pauVar17 = auVar47;
              pauVar17[1] = auVar88;
              pauVar17 = pauVar17 + 2;
              pfVar15 = pfVar15 + iVar8;
            }
          }
          else {
            pfVar15 = (float *)((long)A->data + lVar12 * lVar19 * 4 + lVar14 * 4);
          }
          if (iVar6 == 4) {
            pvVar2 = scales->data;
            fVar110 = *(float *)((long)pvVar2 + lVar12 * 4);
            fVar116 = *(float *)((long)pvVar2 + lVar12 * 4 + 4);
            fVar117 = *(float *)((long)pvVar2 + lVar12 * 4 + 8);
            fVar118 = *(float *)((long)pvVar2 + lVar12 * 4 + 0xc);
            for (iVar7 = 3; iVar7 < max_kk; iVar7 = iVar7 + 4) {
              auVar32._0_4_ = fVar110 * *pfVar15;
              auVar32._4_4_ = fVar110 * pfVar15[1];
              auVar32._8_4_ = fVar110 * pfVar15[2];
              auVar32._12_4_ = fVar110 * pfVar15[3];
              auVar69._0_4_ = fVar116 * pfVar15[4];
              auVar69._4_4_ = fVar116 * pfVar15[5];
              auVar69._8_4_ = fVar116 * pfVar15[6];
              auVar69._12_4_ = fVar116 * pfVar15[7];
              auVar112._0_4_ = fVar117 * pfVar15[8];
              auVar112._4_4_ = fVar117 * pfVar15[9];
              auVar112._8_4_ = fVar117 * pfVar15[10];
              auVar112._12_4_ = fVar117 * pfVar15[0xb];
              auVar126._0_4_ = fVar118 * pfVar15[0xc];
              auVar126._4_4_ = fVar118 * pfVar15[0xd];
              auVar126._8_4_ = fVar118 * pfVar15[0xe];
              auVar126._12_4_ = fVar118 * pfVar15[0xf];
              auVar88 = vandps_avx(auVar32,auVar95);
              auVar47 = vorps_avx(auVar88,auVar106);
              auVar88 = vandps_avx(auVar69,auVar95);
              auVar26 = vorps_avx(auVar88,auVar106);
              auVar88 = vandps_avx(auVar112,auVar95);
              auVar27 = vorps_avx(auVar88,auVar106);
              auVar88 = vandps_avx(auVar126,auVar95);
              auVar88 = vorps_avx(auVar88,auVar106);
              fVar125 = auVar126._0_4_ + auVar88._0_4_;
              fVar130 = auVar126._4_4_ + auVar88._4_4_;
              fVar131 = auVar126._8_4_ + auVar88._8_4_;
              fVar132 = auVar126._12_4_ + auVar88._12_4_;
              in_ZMM13 = ZEXT1664(CONCAT412(fVar132,CONCAT48(fVar131,CONCAT44(fVar130,fVar125))));
              auVar33._0_4_ = (int)(auVar47._0_4_ + auVar32._0_4_);
              auVar33._4_4_ = (int)(auVar47._4_4_ + auVar32._4_4_);
              auVar33._8_4_ = (int)(auVar47._8_4_ + auVar32._8_4_);
              auVar33._12_4_ = (int)(auVar47._12_4_ + auVar32._12_4_);
              auVar70._0_4_ = (int)(auVar26._0_4_ + auVar69._0_4_);
              auVar70._4_4_ = (int)(auVar26._4_4_ + auVar69._4_4_);
              auVar70._8_4_ = (int)(auVar26._8_4_ + auVar69._8_4_);
              auVar70._12_4_ = (int)(auVar26._12_4_ + auVar69._12_4_);
              auVar88 = vpackssdw_avx(auVar33,auVar70);
              auVar71._0_4_ = (int)(auVar112._0_4_ + auVar27._0_4_);
              auVar71._4_4_ = (int)(auVar112._4_4_ + auVar27._4_4_);
              auVar71._8_4_ = (int)(auVar112._8_4_ + auVar27._8_4_);
              auVar71._12_4_ = (int)(auVar112._12_4_ + auVar27._12_4_);
              auVar113._0_4_ = (int)fVar125;
              auVar113._4_4_ = (int)fVar130;
              auVar113._8_4_ = (int)fVar131;
              auVar113._12_4_ = (int)fVar132;
              auVar47 = vpackssdw_avx(auVar71,auVar113);
              auVar88 = vpminsw_avx(auVar88,auVar53);
              auVar47 = vpminsw_avx(auVar47,auVar53);
              auVar88 = vpmaxsw_avx(auVar88,auVar87);
              auVar47 = vpmaxsw_avx(auVar47,auVar87);
              auVar85 = ZEXT1664(auVar47);
              auVar88 = vpacksswb_avx(auVar88,auVar47);
              auVar88 = vpshufb_avx(auVar88,_DAT_00546790);
              in_ZMM2 = ZEXT1664(auVar88);
              *pauVar17 = auVar88;
              pauVar17 = pauVar17 + 1;
              pfVar15 = pfVar15 + iVar9;
            }
            auVar133 = ZEXT1664(CONCAT412(0xff81ff81,CONCAT48(0xff81ff81,0xff81ff81ff81ff81)));
          }
          if (iVar6 == 1) {
            auVar88 = *(undefined1 (*) [16])((long)scales->data + uVar16 * 4 + lVar23 * 4);
            iVar7 = 0;
            while( true ) {
              fVar110 = auVar88._0_4_;
              fVar116 = auVar88._4_4_;
              fVar117 = auVar88._8_4_;
              fVar118 = auVar88._12_4_;
              if (max_kk <= iVar7 + 1) break;
              auVar34._0_4_ = fVar110 * *pfVar15;
              auVar34._4_4_ = fVar116 * pfVar15[1];
              auVar34._8_4_ = fVar117 * pfVar15[2];
              auVar34._12_4_ = fVar118 * pfVar15[3];
              pfVar13 = pfVar15 + iVar1;
              auVar72._0_4_ = fVar110 * *pfVar13;
              auVar72._4_4_ = fVar116 * pfVar13[1];
              auVar72._8_4_ = fVar117 * pfVar13[2];
              auVar72._12_4_ = fVar118 * pfVar13[3];
              auVar89 = vunpcklps_avx(auVar34,auVar72);
              auVar27 = vunpckhps_avx(auVar34,auVar72);
              auVar47 = vandps_avx(auVar89,auVar95);
              auVar26 = vandps_avx(auVar27,auVar95);
              auVar47 = vorps_avx(auVar47,auVar106);
              auVar26 = vorps_avx(auVar26,auVar106);
              auVar73._0_4_ = (int)(auVar89._0_4_ + auVar47._0_4_);
              auVar73._4_4_ = (int)(auVar89._4_4_ + auVar47._4_4_);
              auVar73._8_4_ = (int)(auVar89._8_4_ + auVar47._8_4_);
              auVar73._12_4_ = (int)(auVar89._12_4_ + auVar47._12_4_);
              auVar85 = ZEXT1664(auVar73);
              auVar35._0_4_ = (int)(auVar26._0_4_ + auVar27._0_4_);
              auVar35._4_4_ = (int)(auVar26._4_4_ + auVar27._4_4_);
              auVar35._8_4_ = (int)(auVar26._8_4_ + auVar27._8_4_);
              auVar35._12_4_ = (int)(auVar26._12_4_ + auVar27._12_4_);
              auVar47 = vpackssdw_avx(auVar73,auVar35);
              auVar47 = vpminsw_avx(auVar136._0_16_,auVar47);
              auVar47 = vpmaxsw_avx(auVar133._0_16_,auVar47);
              auVar47 = vpacksswb_avx(auVar47,auVar47);
              in_ZMM2 = ZEXT1664(auVar47);
              *(long *)*pauVar17 = auVar47._0_8_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 8);
              iVar7 = iVar7 + 2;
              pfVar15 = pfVar15 + iVar5;
            }
            for (; iVar7 < max_kk; iVar7 = iVar7 + 1) {
              auVar36._0_4_ = fVar110 * *pfVar15;
              auVar36._4_4_ = fVar116 * pfVar15[1];
              auVar36._8_4_ = fVar117 * pfVar15[2];
              auVar36._12_4_ = fVar118 * pfVar15[3];
              auVar88 = vandps_avx(auVar36,auVar95);
              auVar88 = vorps_avx(auVar88,auVar106);
              auVar85 = ZEXT1664(auVar88);
              auVar37._0_4_ = (int)(auVar36._0_4_ + auVar88._0_4_);
              auVar37._4_4_ = (int)(auVar36._4_4_ + auVar88._4_4_);
              auVar37._8_4_ = (int)(auVar36._8_4_ + auVar88._8_4_);
              auVar37._12_4_ = (int)(auVar36._12_4_ + auVar88._12_4_);
              auVar88 = vpackssdw_avx(auVar37,auVar37);
              auVar88 = vpminsw_avx(auVar136._0_16_,auVar88);
              auVar88 = vpmaxsw_avx(auVar133._0_16_,auVar88);
              auVar88 = vpacksswb_avx(auVar88,auVar88);
              in_ZMM2 = ZEXT1664(auVar88);
              *(int *)*pauVar17 = auVar88._0_4_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              pfVar15 = pfVar15 + iVar1;
            }
          }
          lVar22 = lVar22 + lVar19 * 0x10;
        }
        auVar114._8_4_ = 0x3effffff;
        auVar114._0_8_ = 0x3effffff3effffff;
        auVar114._12_4_ = 0x3effffff;
        while( true ) {
          auVar26 = auVar136._0_16_;
          auVar47 = auVar133._0_16_;
          if (lVar11 <= (long)(uVar16 | 1)) break;
          lVar12 = uVar16 + lVar23;
          if (iVar6 == 8) {
            fVar110 = *(float *)((long)scales->data + lVar12 * 4);
            fVar116 = *(float *)((long)scales->data + lVar12 * 4 + 4);
            pfVar15 = (float *)((long)A->data + lVar22);
            for (iVar7 = 7; iVar7 < max_kk; iVar7 = iVar7 + 8) {
              auVar65._0_4_ = fVar110 * *pfVar15;
              auVar65._4_4_ = fVar110 * pfVar15[1];
              auVar65._8_4_ = fVar110 * pfVar15[2];
              auVar65._12_4_ = fVar110 * pfVar15[3];
              auVar65._16_4_ = fVar110 * pfVar15[4];
              auVar65._20_4_ = fVar110 * pfVar15[5];
              auVar65._28_36_ = in_ZMM2._28_36_;
              auVar65._24_4_ = fVar110 * pfVar15[6];
              auVar86._0_4_ = fVar116 * pfVar15[8];
              auVar86._4_4_ = fVar116 * pfVar15[9];
              auVar86._8_4_ = fVar116 * pfVar15[10];
              auVar86._12_4_ = fVar116 * pfVar15[0xb];
              auVar86._16_4_ = fVar116 * pfVar15[0xc];
              auVar86._20_4_ = fVar116 * pfVar15[0xd];
              auVar86._28_36_ = auVar85._28_36_;
              auVar86._24_4_ = fVar116 * pfVar15[0xe];
              auVar82 = vandps_avx(auVar65._0_32_,auVar24);
              auVar54 = vandps_avx(auVar86._0_32_,auVar24);
              auVar82 = vorps_avx(auVar82,auVar25);
              auVar54 = vorps_avx(auVar54,auVar25);
              auVar38._0_4_ = (int)(auVar82._0_4_ + auVar65._0_4_);
              auVar38._4_4_ = (int)(auVar82._4_4_ + auVar65._4_4_);
              auVar38._8_4_ = (int)(auVar82._8_4_ + auVar65._8_4_);
              auVar38._12_4_ = (int)(auVar82._12_4_ + auVar65._12_4_);
              auVar61._16_4_ = (int)(auVar82._16_4_ + auVar65._16_4_);
              auVar61._0_16_ = auVar38;
              auVar61._20_4_ = (int)(auVar82._20_4_ + auVar65._20_4_);
              auVar61._24_4_ = (int)(auVar82._24_4_ + auVar65._24_4_);
              auVar61._28_4_ = (int)(auVar82._28_4_ + in_ZMM2._28_4_);
              auVar74._0_4_ = (int)(auVar54._0_4_ + auVar86._0_4_);
              auVar74._4_4_ = (int)(auVar54._4_4_ + auVar86._4_4_);
              auVar74._8_4_ = (int)(auVar54._8_4_ + auVar86._8_4_);
              auVar74._12_4_ = (int)(auVar54._12_4_ + auVar86._12_4_);
              auVar84._16_4_ = (int)(auVar54._16_4_ + auVar86._16_4_);
              auVar84._0_16_ = auVar74;
              auVar84._20_4_ = (int)(auVar54._20_4_ + auVar86._20_4_);
              auVar84._24_4_ = (int)(auVar54._24_4_ + auVar86._24_4_);
              auVar84._28_4_ = (int)(auVar54._28_4_ + auVar85._28_4_);
              auVar27 = vpackssdw_avx(auVar38,auVar61._16_16_);
              auVar89 = vpackssdw_avx(auVar74,auVar84._16_16_);
              auVar27 = vpminsw_avx(auVar27,auVar53);
              auVar89 = vpminsw_avx(auVar89,auVar53);
              auVar27 = vpmaxsw_avx(auVar27,auVar87);
              auVar89 = vpmaxsw_avx(auVar89,auVar87);
              auVar85 = ZEXT1664(auVar89);
              auVar27 = vpacksswb_avx(auVar27,auVar89);
              auVar27 = vpshufb_avx(auVar27,auVar88);
              in_ZMM2 = ZEXT1664(auVar27);
              *pauVar17 = auVar27;
              pauVar17 = pauVar17 + 1;
              pfVar15 = pfVar15 + iVar8;
            }
          }
          else {
            pfVar15 = (float *)((long)A->data + lVar12 * lVar19 * 4 + lVar14 * 4);
          }
          if (iVar6 == 4) {
            fVar110 = *(float *)((long)scales->data + lVar12 * 4);
            fVar116 = *(float *)((long)scales->data + lVar12 * 4 + 4);
            for (iVar7 = 3; iVar7 < max_kk; iVar7 = iVar7 + 4) {
              auVar39._0_4_ = fVar110 * *pfVar15;
              auVar39._4_4_ = fVar110 * pfVar15[1];
              auVar39._8_4_ = fVar110 * pfVar15[2];
              auVar39._12_4_ = fVar110 * pfVar15[3];
              auVar75._0_4_ = fVar116 * pfVar15[4];
              auVar75._4_4_ = fVar116 * pfVar15[5];
              auVar75._8_4_ = fVar116 * pfVar15[6];
              auVar75._12_4_ = fVar116 * pfVar15[7];
              auVar90 = vmovlhps_avx(auVar39,auVar75);
              auVar91 = vunpckhpd_avx(auVar39,auVar75);
              auVar27 = vandps_avx(auVar90,auVar95);
              auVar89 = vandps_avx(auVar91,auVar95);
              auVar27 = vorps_avx(auVar27,auVar106);
              auVar89 = vorps_avx(auVar89,auVar106);
              auVar76._0_4_ = (int)(auVar90._0_4_ + auVar27._0_4_);
              auVar76._4_4_ = (int)(auVar90._4_4_ + auVar27._4_4_);
              auVar76._8_4_ = (int)(auVar90._8_4_ + auVar27._8_4_);
              auVar76._12_4_ = (int)(auVar90._12_4_ + auVar27._12_4_);
              auVar85 = ZEXT1664(auVar76);
              auVar40._0_4_ = (int)(auVar89._0_4_ + auVar91._0_4_);
              auVar40._4_4_ = (int)(auVar89._4_4_ + auVar91._4_4_);
              auVar40._8_4_ = (int)(auVar89._8_4_ + auVar91._8_4_);
              auVar40._12_4_ = (int)(auVar89._12_4_ + auVar91._12_4_);
              auVar27 = vpackssdw_avx(auVar76,auVar40);
              auVar27 = vpminsw_avx(auVar26,auVar27);
              auVar27 = vpmaxsw_avx(auVar47,auVar27);
              auVar27 = vpacksswb_avx(auVar27,auVar27);
              in_ZMM2 = ZEXT1664(auVar27);
              *(long *)*pauVar17 = auVar27._0_8_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 8);
              pfVar15 = pfVar15 + iVar9;
            }
          }
          if (iVar6 == 1) {
            fVar110 = *(float *)((long)scales->data + lVar12 * 4);
            auVar119._4_4_ = fVar110;
            auVar119._0_4_ = fVar110;
            auVar119._8_4_ = fVar110;
            auVar119._12_4_ = fVar110;
            fVar116 = *(float *)((long)scales->data + lVar12 * 4 + 4);
            auVar121._4_4_ = fVar116;
            auVar121._0_4_ = fVar116;
            auVar121._8_4_ = fVar116;
            auVar121._12_4_ = fVar116;
            pfVar13 = pfVar15 + 1;
            for (iVar7 = 0; iVar7 + 3 < max_kk; iVar7 = iVar7 + 4) {
              auVar41._8_8_ = 0;
              auVar41._0_8_ = *(ulong *)pfVar15;
              auVar77._8_8_ = 0;
              auVar77._0_8_ = *(ulong *)(pfVar15 + iVar1);
              auVar89 = vunpcklps_avx(auVar41,auVar77);
              auVar78._8_8_ = 0;
              auVar78._0_8_ = *(ulong *)(pfVar15 + iVar5);
              auVar123._8_8_ = 0;
              auVar123._0_8_ = *(ulong *)(pfVar15 + iVar1 * 3);
              auVar90 = vunpcklps_avx(auVar78,auVar123);
              auVar27 = vmovlhps_avx(auVar89,auVar90);
              auVar89 = vunpckhpd_avx(auVar89,auVar90);
              auVar79._0_4_ = fVar110 * auVar27._0_4_;
              auVar79._4_4_ = fVar110 * auVar27._4_4_;
              auVar79._8_4_ = fVar110 * auVar27._8_4_;
              auVar79._12_4_ = fVar110 * auVar27._12_4_;
              auVar42._0_4_ = fVar116 * auVar89._0_4_;
              auVar42._4_4_ = fVar116 * auVar89._4_4_;
              auVar42._8_4_ = fVar116 * auVar89._8_4_;
              auVar42._12_4_ = fVar116 * auVar89._12_4_;
              auVar90 = vmovlhps_avx(auVar79,auVar42);
              auVar91 = vunpckhpd_avx(auVar79,auVar42);
              auVar27 = vandps_avx(auVar90,auVar95);
              auVar89 = vandps_avx(auVar91,auVar95);
              auVar27 = vorps_avx(auVar27,auVar106);
              auVar89 = vorps_avx(auVar89,auVar106);
              auVar80._0_4_ = (int)(auVar90._0_4_ + auVar27._0_4_);
              auVar80._4_4_ = (int)(auVar90._4_4_ + auVar27._4_4_);
              auVar80._8_4_ = (int)(auVar90._8_4_ + auVar27._8_4_);
              auVar80._12_4_ = (int)(auVar90._12_4_ + auVar27._12_4_);
              auVar85 = ZEXT1664(auVar80);
              auVar43._0_4_ = (int)(auVar89._0_4_ + auVar91._0_4_);
              auVar43._4_4_ = (int)(auVar89._4_4_ + auVar91._4_4_);
              auVar43._8_4_ = (int)(auVar89._8_4_ + auVar91._8_4_);
              auVar43._12_4_ = (int)(auVar89._12_4_ + auVar91._12_4_);
              auVar27 = vpackssdw_avx(auVar80,auVar43);
              auVar27 = vpminsw_avx(auVar26,auVar27);
              auVar27 = vpmaxsw_avx(auVar47,auVar27);
              auVar27 = vpacksswb_avx(auVar27,auVar27);
              in_ZMM2 = ZEXT1664(auVar27);
              *(long *)*pauVar17 = auVar27._0_8_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 8);
              pfVar15 = pfVar15 + iVar9;
              pfVar13 = pfVar13 + iVar9;
            }
            auVar27 = vmovlhps_avx(auVar119,auVar121);
            for (; iVar7 + 1 < max_kk; iVar7 = iVar7 + 2) {
              auVar44._8_8_ = 0;
              auVar44._0_8_ = *(ulong *)pfVar15;
              auVar81._8_8_ = 0;
              auVar81._0_8_ = *(ulong *)(pfVar15 + iVar1);
              auVar89 = vunpcklps_avx(auVar44,auVar81);
              auVar45._0_4_ = auVar27._0_4_ * auVar89._0_4_;
              auVar45._4_4_ = auVar27._4_4_ * auVar89._4_4_;
              auVar45._8_4_ = auVar27._8_4_ * auVar89._8_4_;
              auVar45._12_4_ = auVar27._12_4_ * auVar89._12_4_;
              auVar89 = vandps_avx(auVar45,auVar95);
              auVar89 = vorps_avx(auVar89,auVar106);
              auVar85 = ZEXT1664(auVar89);
              auVar46._0_4_ = (int)(auVar45._0_4_ + auVar89._0_4_);
              auVar46._4_4_ = (int)(auVar45._4_4_ + auVar89._4_4_);
              auVar46._8_4_ = (int)(auVar45._8_4_ + auVar89._8_4_);
              auVar46._12_4_ = (int)(auVar45._12_4_ + auVar89._12_4_);
              auVar89 = vpackssdw_avx(auVar46,auVar46);
              auVar89 = vpminsw_avx(auVar26,auVar89);
              auVar89 = vpmaxsw_avx(auVar47,auVar89);
              auVar89 = vpacksswb_avx(auVar89,auVar89);
              in_ZMM2 = ZEXT1664(auVar89);
              *(int *)*pauVar17 = auVar89._0_4_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              pfVar15 = pfVar15 + iVar5;
              pfVar13 = pfVar13 + iVar5;
            }
            for (; iVar7 < max_kk; iVar7 = iVar7 + 1) {
              auVar47 = vandps_avx(ZEXT416((uint)(fVar110 * pfVar13[-1])),auVar95);
              auVar47 = vorps_avx(auVar114,auVar47);
              auVar47 = ZEXT416((uint)(fVar110 * pfVar13[-1] + auVar47._0_4_));
              auVar47 = vroundss_avx(auVar47,auVar47,0xb);
              iVar18 = (int)auVar47._0_4_;
              if ((int)auVar47._0_4_ < -0x7e) {
                iVar18 = -0x7f;
              }
              if (0x7e < iVar18) {
                iVar18 = 0x7f;
              }
              (*pauVar17)[0] = (char)iVar18;
              auVar47 = vandps_avx(ZEXT416((uint)(fVar116 * *pfVar13)),auVar95);
              auVar47 = vorps_avx(auVar114,auVar47);
              auVar85 = ZEXT1664(auVar47);
              auVar47 = ZEXT416((uint)(fVar116 * *pfVar13 + auVar47._0_4_));
              auVar47 = vroundss_avx(auVar47,auVar47,0xb);
              in_ZMM2 = ZEXT1664(auVar47);
              iVar18 = (int)auVar47._0_4_;
              if ((int)auVar47._0_4_ < -0x7e) {
                iVar18 = -0x7f;
              }
              if (0x7e < iVar18) {
                iVar18 = 0x7f;
              }
              (*pauVar17)[1] = (char)iVar18;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 2);
              pfVar13 = pfVar13 + iVar1;
            }
          }
          uVar16 = uVar16 + 2;
          lVar22 = lVar22 + lVar19 * 8;
        }
        for (; (long)uVar16 < lVar11; uVar16 = uVar16 + 1) {
          fVar110 = *(float *)((long)scales->data + (lVar23 + uVar16) * 4);
          if (iVar6 == 8) {
            auVar53 = vshufps_avx(ZEXT416((uint)fVar110),ZEXT416((uint)fVar110),0);
            pfVar15 = (float *)((long)A->data + lVar22);
            for (iVar7 = 7; iVar7 < max_kk; iVar7 = iVar7 + 8) {
              auVar66._0_4_ = auVar53._0_4_ * *pfVar15;
              auVar66._4_4_ = auVar53._4_4_ * pfVar15[1];
              auVar66._8_4_ = auVar53._8_4_ * pfVar15[2];
              auVar66._12_4_ = auVar53._12_4_ * pfVar15[3];
              auVar66._16_4_ = auVar53._0_4_ * pfVar15[4];
              auVar66._20_4_ = auVar53._4_4_ * pfVar15[5];
              auVar66._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
              auVar66._24_4_ = auVar53._8_4_ * pfVar15[6];
              auVar82 = vandps_avx(auVar66._0_32_,auVar24);
              auVar82 = vorps_avx(auVar82,auVar25);
              auVar48._0_4_ = (int)(auVar66._0_4_ + auVar82._0_4_);
              auVar48._4_4_ = (int)(auVar66._4_4_ + auVar82._4_4_);
              auVar48._8_4_ = (int)(auVar66._8_4_ + auVar82._8_4_);
              auVar48._12_4_ = (int)(auVar66._12_4_ + auVar82._12_4_);
              auVar62._16_4_ = (int)(auVar66._16_4_ + auVar82._16_4_);
              auVar62._0_16_ = auVar48;
              auVar62._20_4_ = (int)(auVar66._20_4_ + auVar82._20_4_);
              auVar62._24_4_ = (int)(auVar66._24_4_ + auVar82._24_4_);
              auVar62._28_4_ = (int)(auVar82._28_4_ + 0.0);
              auVar87 = vpackssdw_avx(auVar48,auVar62._16_16_);
              auVar87 = vpminsw_avx(auVar26,auVar87);
              auVar87 = vpmaxsw_avx(auVar47,auVar87);
              auVar87 = vpacksswb_avx(auVar87,auVar87);
              *(long *)*pauVar17 = auVar87._0_8_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 8);
              pfVar15 = pfVar15 + iVar8;
            }
          }
          else {
            pfVar15 = (float *)((long)A->data + (lVar23 + uVar16) * lVar19 * 4 + lVar14 * 4);
          }
          auVar53 = ZEXT416((uint)fVar110);
          if (iVar6 == 4) {
            auVar87 = vshufps_avx(auVar53,auVar53,0);
            for (iVar7 = 3; iVar7 < max_kk; iVar7 = iVar7 + 4) {
              auVar49._0_4_ = auVar87._0_4_ * *pfVar15;
              auVar49._4_4_ = auVar87._4_4_ * pfVar15[1];
              auVar49._8_4_ = auVar87._8_4_ * pfVar15[2];
              auVar49._12_4_ = auVar87._12_4_ * pfVar15[3];
              auVar88 = vandps_avx(auVar49,auVar95);
              auVar88 = vorps_avx(auVar88,auVar106);
              auVar50._0_4_ = (int)(auVar49._0_4_ + auVar88._0_4_);
              auVar50._4_4_ = (int)(auVar49._4_4_ + auVar88._4_4_);
              auVar50._8_4_ = (int)(auVar49._8_4_ + auVar88._8_4_);
              auVar50._12_4_ = (int)(auVar49._12_4_ + auVar88._12_4_);
              auVar88 = vpackssdw_avx(auVar50,auVar50);
              auVar88 = vpminsw_avx(auVar26,auVar88);
              auVar88 = vpmaxsw_avx(auVar47,auVar88);
              auVar88 = vpacksswb_avx(auVar88,auVar88);
              *(int *)*pauVar17 = auVar88._0_4_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              pfVar15 = pfVar15 + iVar9;
            }
          }
          if (iVar6 == 1) {
            auVar53 = vshufps_avx(auVar53,auVar53,0);
            for (lVar12 = 0; (int)lVar12 + 3 < max_kk; lVar12 = lVar12 + 4) {
              auVar87 = vinsertps_avx(ZEXT416((uint)*pfVar15),ZEXT416((uint)pfVar15[iVar1]),0x10);
              auVar87 = vinsertps_avx(auVar87,ZEXT416((uint)pfVar15[iVar5]),0x20);
              auVar87 = vinsertps_avx(auVar87,ZEXT416((uint)pfVar15[iVar1 * 3]),0x30);
              auVar51._0_4_ = auVar87._0_4_ * auVar53._0_4_;
              auVar51._4_4_ = auVar87._4_4_ * auVar53._4_4_;
              auVar51._8_4_ = auVar87._8_4_ * auVar53._8_4_;
              auVar51._12_4_ = auVar87._12_4_ * auVar53._12_4_;
              auVar87 = vandps_avx(auVar51,auVar95);
              auVar87 = vorps_avx(auVar87,auVar106);
              auVar52._0_4_ = (int)(auVar51._0_4_ + auVar87._0_4_);
              auVar52._4_4_ = (int)(auVar51._4_4_ + auVar87._4_4_);
              auVar52._8_4_ = (int)(auVar51._8_4_ + auVar87._8_4_);
              auVar52._12_4_ = (int)(auVar51._12_4_ + auVar87._12_4_);
              auVar87 = vpackssdw_avx(auVar52,auVar52);
              auVar87 = vpminsw_avx(auVar26,auVar87);
              auVar87 = vpmaxsw_avx(auVar47,auVar87);
              auVar87 = vpacksswb_avx(auVar87,auVar87);
              *(int *)(*pauVar17 + lVar12) = auVar87._0_4_;
              pfVar15 = pfVar15 + iVar9;
            }
            for (; (int)lVar12 < max_kk; lVar12 = lVar12 + 1) {
              auVar53 = vandps_avx(ZEXT416((uint)(fVar110 * *pfVar15)),auVar95);
              auVar53 = vorps_avx(auVar114,auVar53);
              auVar53 = ZEXT416((uint)(fVar110 * *pfVar15 + auVar53._0_4_));
              auVar53 = vroundss_avx(auVar53,auVar53,0xb);
              iVar7 = (int)auVar53._0_4_;
              if (iVar7 < -0x7e) {
                iVar7 = -0x7f;
              }
              if (0x7e < iVar7) {
                iVar7 = 0x7f;
              }
              (*pauVar17)[lVar12] = (char)iVar7;
              pfVar15 = pfVar15 + iVar1;
            }
            pauVar17 = (undefined1 (*) [16])(*pauVar17 + lVar12);
          }
          lVar22 = lVar22 + lVar19 * 4;
        }
      }
      else {
        transpose_pack_A_tile_fp32_to_int8_avx2(A,AT,i,max_ii,k,max_kk,scales);
      }
    }
    else {
      transpose_pack_A_tile_fp32_to_int8_avxvnni(A,AT,i,max_ii,k,max_kk,scales);
    }
    return;
  }
  transpose_pack_A_tile_fp32_to_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk,scales);
  return;
}

Assistant:

static void transpose_pack_A_tile_quantize(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk, const Mat& scales)
{
    transpose_pack_A_tile_fp32_to_int8(A, AT, i, max_ii, k, max_kk, scales);
}